

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall Catch::Section::Section(Section *this,SectionInfo *info)

{
  pointer pcVar1;
  size_t sVar2;
  int iVar3;
  IResultCapture *pIVar4;
  uint64_t uVar5;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_001a9f08;
  (this->m_info).name._M_dataplus._M_p = (pointer)&(this->m_info).name.field_2;
  pcVar1 = (info->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_info,pcVar1,pcVar1 + (info->name)._M_string_length);
  (this->m_info).description._M_dataplus._M_p = (pointer)&(this->m_info).description.field_2;
  pcVar1 = (info->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).description,pcVar1,
             pcVar1 + (info->description)._M_string_length);
  sVar2 = (info->lineInfo).line;
  (this->m_info).lineInfo.file = (info->lineInfo).file;
  (this->m_info).lineInfo.line = sVar2;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_assertions).passed = 0;
  (this->m_assertions).failed = 0;
  (this->m_assertions).failedButOk = 0;
  pIVar4 = getResultCapture();
  iVar3 = (*pIVar4->_vptr_IResultCapture[2])(pIVar4,&this->m_info,&this->m_assertions);
  this->m_sectionIncluded = SUB41(iVar3,0);
  (this->m_timer).m_nanoseconds = 0;
  uVar5 = std::chrono::_V2::system_clock::now();
  (this->m_timer).m_nanoseconds = uVar5;
  return;
}

Assistant:

Section::Section( SectionInfo const& info )
    :   m_info( info ),
        m_sectionIncluded( getResultCapture().sectionStarted( m_info, m_assertions ) )
    {
        m_timer.start();
    }